

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode_strategy.c
# Opt level: O0

void update_frame_flags(AV1_COMMON *cm,RefreshFrameInfo *refresh_frame,uint *frame_flags)

{
  int iVar1;
  uint *in_RDX;
  byte *in_RSI;
  AV1_COMMON *in_RDI;
  
  iVar1 = encode_show_existing_frame(in_RDI);
  if (iVar1 == 0) {
    if ((*in_RSI & 1) == 0) {
      *in_RDX = *in_RDX & 0xfffffffd;
    }
    else {
      *in_RDX = *in_RDX | 2;
    }
    if ((in_RSI[2] & 1) == 0) {
      *in_RDX = *in_RDX & 0xfffffff7;
    }
    else {
      *in_RDX = *in_RDX | 8;
    }
    if ((in_RSI[1] & 1) == 0) {
      *in_RDX = *in_RDX & 0xfffffffb;
    }
    else {
      *in_RDX = *in_RDX | 4;
    }
    if ((in_RDI->current_frame).frame_type == '\0') {
      *in_RDX = *in_RDX | 1;
    }
    else {
      *in_RDX = *in_RDX & 0xfffffffe;
    }
  }
  else {
    *in_RDX = *in_RDX & 0xfffffffd;
    *in_RDX = *in_RDX & 0xfffffffb;
    *in_RDX = *in_RDX & 0xfffffff7;
    *in_RDX = *in_RDX & 0xfffffffe;
  }
  return;
}

Assistant:

static void update_frame_flags(const AV1_COMMON *const cm,
                               const RefreshFrameInfo *const refresh_frame,
                               unsigned int *frame_flags) {
  if (encode_show_existing_frame(cm)) {
    *frame_flags &= ~(uint32_t)FRAMEFLAGS_GOLDEN;
    *frame_flags &= ~(uint32_t)FRAMEFLAGS_BWDREF;
    *frame_flags &= ~(uint32_t)FRAMEFLAGS_ALTREF;
    *frame_flags &= ~(uint32_t)FRAMEFLAGS_KEY;
    return;
  }

  if (refresh_frame->golden_frame) {
    *frame_flags |= FRAMEFLAGS_GOLDEN;
  } else {
    *frame_flags &= ~(uint32_t)FRAMEFLAGS_GOLDEN;
  }

  if (refresh_frame->alt_ref_frame) {
    *frame_flags |= FRAMEFLAGS_ALTREF;
  } else {
    *frame_flags &= ~(uint32_t)FRAMEFLAGS_ALTREF;
  }

  if (refresh_frame->bwd_ref_frame) {
    *frame_flags |= FRAMEFLAGS_BWDREF;
  } else {
    *frame_flags &= ~(uint32_t)FRAMEFLAGS_BWDREF;
  }

  if (cm->current_frame.frame_type == KEY_FRAME) {
    *frame_flags |= FRAMEFLAGS_KEY;
  } else {
    *frame_flags &= ~(uint32_t)FRAMEFLAGS_KEY;
  }
}